

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.cpp
# Opt level: O1

bool duckdb::TrySubtractOperator::Operation<long,long,long>
               (int64_t left,int64_t right,int64_t *result)

{
  *result = left - right;
  return !SBORROW8(left,right);
}

Assistant:

bool TrySubtractOperator::Operation(int64_t left, int64_t right, int64_t &result) {
#if (__GNUC__ >= 5) || defined(__clang__)
	if (__builtin_sub_overflow(left, right, &result)) {
		return false;
	}
#else
	if (right < 0) {
		if (NumericLimits<int64_t>::Maximum() + right < left) {
			return false;
		}
	} else {
		if (NumericLimits<int64_t>::Minimum() + right > left) {
			return false;
		}
	}
	result = left - right;
#endif
	return true;
}